

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo_commands.cpp
# Opt level: O2

void __thiscall
CommandDrawNumber::Tick
          (CommandDrawNumber *this,SBarInfoMainBlock *block,DSBarInfo *statusBar,bool hudChanged)

{
  FString *this_00;
  player_t *ppVar1;
  SBarInfo *pSVar2;
  char *pcVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  AHexenArmor *pAVar7;
  FBaseCVar *pFVar8;
  AAmmo *pAVar9;
  AInventory *pAVar10;
  Node *pNVar11;
  APlayerPawn *this_01;
  uint uVar12;
  BYTE *pBVar13;
  byte bVar14;
  uint uVar15;
  double dVar16;
  long lStack_30;
  
  if ((this->super_CommandDrawString).field_0x5f == '\x01') {
    (this->super_CommandDrawString).cache = -1;
    CommandDrawString::Tick(&this->super_CommandDrawString,block,statusBar,hudChanged);
  }
  uVar12 = (this->super_CommandDrawString).valueArgument;
  if (INTCVAR < this->value) goto LAB_004b76fc;
  switch(this->value) {
  case HEALTH:
    uVar6 = (((statusBar->super_DBaseStatusBar).CPlayer)->mo->super_AActor).health;
    pSVar2 = (this->super_CommandDrawString).super_SBarInfoCommand.script;
    uVar12 = 0;
    if (0 < (int)uVar6) {
      uVar12 = uVar6;
    }
    if (pSVar2->lowerHealthCap == false) {
      uVar12 = uVar6;
    }
    if (pSVar2->interpolateHealth == true) {
      iVar5 = pSVar2->interpolationSpeed;
LAB_004b76f9:
      this->interpolationSpeed = iVar5;
    }
    break;
  case ARMOR:
    if (statusBar->armor == (ABasicArmor *)0x0) {
      uVar12 = 0;
    }
    else {
      uVar12 = (statusBar->armor->super_AArmor).super_AInventory.Amount;
    }
    pSVar2 = (this->super_CommandDrawString).super_SBarInfoCommand.script;
    if (pSVar2->interpolateArmor == true) {
      iVar5 = pSVar2->armorInterpolationSpeed;
      goto LAB_004b76f9;
    }
    break;
  case AMMO1:
    if (statusBar->ammo1 == (AAmmo *)0x0) goto LAB_004b776d;
    uVar12 = statusBar->ammocount1;
    break;
  case AMMO2:
    if (statusBar->ammo2 == (AAmmo *)0x0) goto LAB_004b776d;
    uVar12 = statusBar->ammocount2;
    break;
  default:
    uVar12 = 0;
    pAVar10 = AActor::FindInventory
                        (&((statusBar->super_DBaseStatusBar).CPlayer)->mo->super_AActor,
                         this->inventoryItem,false);
    if (pAVar10 != (AInventory *)0x0) {
LAB_004b7602:
      uVar12 = pAVar10->Amount;
    }
    break;
  case AMMO1CAPACITY:
    pAVar9 = statusBar->ammo1;
    goto LAB_004b7502;
  case AMMO2CAPACITY:
    pAVar9 = statusBar->ammo2;
LAB_004b7502:
    if (pAVar9 == (AAmmo *)0x0) goto LAB_004b776d;
LAB_004b7547:
    uVar12 = (pAVar9->super_AInventory).MaxAmount;
    break;
  case AMMOCAPACITY:
    pAVar9 = (AAmmo *)AActor::FindInventory
                                (&((statusBar->super_DBaseStatusBar).CPlayer)->mo->super_AActor,
                                 this->inventoryItem,false);
    if (pAVar9 == (AAmmo *)0x0) {
      pAVar9 = (AAmmo *)(this->inventoryItem->super_PClass).Defaults;
    }
    goto LAB_004b7547;
  case FRAGS:
    uVar12 = ((statusBar->super_DBaseStatusBar).CPlayer)->fragcount;
    break;
  case KILLS:
    uVar12 = level.killed_monsters;
    break;
  case MONSTERS:
    uVar12 = level.total_monsters;
    break;
  case ITEMS:
    uVar12 = level.found_items;
    break;
  case TOTALITEMS:
    uVar12 = level.total_items;
    break;
  case SECRETS:
    uVar12 = level.found_secrets;
    break;
  case TOTALSECRETS:
    uVar12 = level.total_secrets;
    break;
  case ARMORCLASS:
  case SAVEPERCENT:
    pAVar7 = AActor::FindInventory<AHexenArmor>
                       (&((statusBar->super_DBaseStatusBar).CPlayer)->mo->super_AActor);
    if (pAVar7 == (AHexenArmor *)0x0) {
      dVar16 = 0.0;
    }
    else {
      dVar16 = pAVar7->Slots[0] + pAVar7->Slots[1] + pAVar7->Slots[2] + pAVar7->Slots[3] +
               pAVar7->Slots[4];
    }
    if (statusBar->armor != (ABasicArmor *)0x0) {
      dVar16 = dVar16 + statusBar->armor->SavePercent * 100.0;
    }
    if (this->value == ARMORCLASS) {
      dVar16 = dVar16 / 5.0;
    }
    uVar12 = (int)dVar16;
    break;
  case GLOBALVAR:
    uVar12 = ACS_GlobalVars[(int)uVar12];
    break;
  case GLOBALARRAY:
    pNVar11 = TMap<int,_int,_THashTraits<int>,_InitIntToZero>::GetNode
                        (ACS_GlobalArrays + (int)uVar12,consoleplayer);
    uVar12 = (pNVar11->Pair).Value;
    break;
  case POWERUPTIME:
    pAVar10 = AActor::FindInventory
                        (&((statusBar->super_DBaseStatusBar).CPlayer)->mo->super_AActor,
                         *(PClassActor **)((this->inventoryItem->super_PClass).Defaults + 0x500),
                         false);
    if (pAVar10 != (AInventory *)0x0) {
      uVar12 = *(int *)&pAVar10->field_0x4fc / 0x23 + 1;
    }
    break;
  case AIRTIME:
    ppVar1 = (statusBar->super_DBaseStatusBar).CPlayer;
    if ((ppVar1->mo->super_AActor).waterlevel < 3) {
      uVar12 = level.airsupply / 0x23;
    }
    else {
      uVar6 = ((ppVar1->air_finished - level.time) + 0x22) / 0x23;
      uVar12 = 0;
      if (0 < (int)uVar6) {
        uVar12 = uVar6;
      }
    }
    break;
  case SELECTEDINVENTORY:
    pAVar10 = GC::ReadBarrier<AInventory>
                        ((AInventory **)&((statusBar->super_DBaseStatusBar).CPlayer)->mo->InvSel);
    if (pAVar10 != (AInventory *)0x0) {
      pAVar10 = GC::ReadBarrier<AInventory>
                          ((AInventory **)&((statusBar->super_DBaseStatusBar).CPlayer)->mo->InvSel);
      goto LAB_004b7602;
    }
    break;
  case SCORE:
    uVar12 = (((statusBar->super_DBaseStatusBar).CPlayer)->mo->super_AActor).Score;
    break;
  case ACCURACY:
    uVar12 = (((statusBar->super_DBaseStatusBar).CPlayer)->mo->super_AActor).accuracy;
    break;
  case STAMINA:
    uVar12 = (((statusBar->super_DBaseStatusBar).CPlayer)->mo->super_AActor).stamina;
    break;
  case KEYS:
    this_01 = ((statusBar->super_DBaseStatusBar).CPlayer)->mo;
    uVar12 = 0;
    while (this_01 = (APlayerPawn *)
                     GC::ReadBarrier<AInventory>((AInventory **)&(this_01->super_AActor).Inventory),
          this_01 != (APlayerPawn *)0x0) {
      bVar4 = DObject::IsKindOf((DObject *)this_01,AKey::RegistrationInfo.MyClass);
      uVar12 = uVar12 + bVar4;
    }
    break;
  case INTCVAR:
    pFVar8 = GetCVar(&((statusBar->super_DBaseStatusBar).CPlayer)->mo->super_AActor,
                     (this->cvarName).Chars);
    uVar12 = 0;
    if ((pFVar8 != (FBaseCVar *)0x0) && (uVar6 = (*pFVar8->_vptr_FBaseCVar[2])(pFVar8), uVar6 < 2))
    {
      uVar12 = (*pFVar8->_vptr_FBaseCVar[4])(pFVar8,1);
    }
  }
LAB_004b76fc:
  uVar6 = this->interpolationSpeed;
  if ((uVar6 == 0) || ((hudChanged && (level.time != 1)))) {
    this->drawValue = uVar12;
    uVar15 = uVar12;
  }
  else {
    uVar15 = this->drawValue;
    if ((int)uVar12 < (int)uVar15) {
      uVar12 = (int)(uVar15 - uVar12) >> 2;
      if ((int)uVar12 < (int)uVar6) {
        uVar6 = uVar12;
      }
      if ((int)uVar12 < 2) {
        uVar6 = 1;
      }
      uVar15 = uVar15 - uVar6;
      this->drawValue = uVar15;
    }
    else if (uVar12 - uVar15 != 0 && (int)uVar15 <= (int)uVar12) {
      uVar12 = (int)(uVar12 - uVar15) >> 2;
      if ((int)uVar12 < (int)uVar6) {
        uVar6 = uVar12;
      }
      if ((int)uVar12 < 2) {
        uVar6 = 1;
      }
      uVar15 = uVar6 + uVar15;
      this->drawValue = uVar15;
    }
  }
  if (((this->super_CommandDrawString).field_0x5d == '\x01') && (uVar15 == 0)) {
LAB_004b776d:
    FString::operator=(&(this->super_CommandDrawString).str,(char *)"");
    return;
  }
  iVar5 = this->lowValue;
  (this->super_CommandDrawString).translation = this->normalTranslation;
  if ((iVar5 == -1) || (iVar5 < (int)uVar15)) {
    if ((this->highValue != -1) && (this->highValue <= (int)uVar15)) {
      lStack_30 = 0x78;
      goto LAB_004b77ae;
    }
  }
  else {
    lStack_30 = 0x70;
LAB_004b77ae:
    (this->super_CommandDrawString).translation =
         *(EColorRange *)
          ((long)&(this->super_CommandDrawString).super_SBarInfoCommand._vptr_SBarInfoCommand +
          lStack_30);
  }
  bVar14 = (this->super_CommandDrawString).field_0x5c;
  uVar12 = (uint)bVar14;
  iVar5 = this->length;
  if ((this->super_CommandDrawString).field_0x5e == '\0') {
    uVar15 = 0x7fffffff;
    if (iVar5 < 10) {
      dVar16 = pow(10.0,(double)iVar5);
      dVar16 = ceil(dVar16);
      uVar15 = (int)dVar16 - 1;
      uVar12 = (uint)(byte)(this->super_CommandDrawString).field_0x5c;
    }
    if ((uVar12 & 1) == 0) {
      uVar12 = this->drawValue;
LAB_004b788e:
      uVar6 = -uVar15;
    }
    else {
      uVar12 = this->drawValue;
      iVar5 = this->length;
      if (iVar5 == 1) goto LAB_004b788e;
      uVar6 = 0x80000000;
      if (iVar5 < 10) {
        dVar16 = pow(10.0,(double)(iVar5 + -1));
        dVar16 = ceil(dVar16);
        uVar6 = (uint)-(dVar16 + -1.0);
      }
    }
    if ((int)uVar12 < (int)uVar15) {
      uVar15 = uVar12;
    }
    if ((int)uVar12 <= (int)uVar6) {
      uVar15 = uVar6;
    }
  }
  else {
    if (9 < iVar5) goto LAB_004b78a5;
    dVar16 = pow(10.0,(double)(int)(iVar5 - (uint)((int)uVar15 < 0 && 1 < iVar5)));
    dVar16 = ceil(dVar16);
    uVar6 = 1;
    if (this->drawValue < (int)dVar16) {
      uVar6 = uVar12;
    }
    bVar14 = (byte)uVar6;
    uVar15 = this->drawValue % (int)dVar16;
  }
  this->drawValue = uVar15;
LAB_004b78a5:
  if ((this->super_CommandDrawString).field_0x5f == '\0') {
    pBVar13 = "";
  }
  else {
    pBVar13 = (BYTE *)(this->super_CommandDrawString).str.Chars;
  }
  this_00 = &(this->super_CommandDrawString).str;
  pcVar3 = (this->prefixPadding).Chars;
  if (bVar14 == 0) {
    FString::Format(this_00,"%s%s%d",pBVar13,pcVar3,(ulong)uVar15);
  }
  else {
    FString::Format(this_00,"%s%s%0*d",pBVar13,pcVar3,
                    (ulong)(uint)(((int)uVar15 >> 0x1f) + this->length),(ulong)uVar15);
  }
  CommandDrawString::RealignString(&this->super_CommandDrawString);
  return;
}

Assistant:

void	Tick(const SBarInfoMainBlock *block, const DSBarInfo *statusBar, bool hudChanged)
		{
			if(usePrefix)
			{
				cache = -1; // Disable the cache since we are using the same variables.
				CommandDrawString::Tick(block, statusBar, hudChanged);
			}

			int num = valueArgument;
			switch(value)
			{
				case HEALTH:
					num = statusBar->CPlayer->mo->health;
					if(script->lowerHealthCap && num < 0) //health shouldn't display negatives
						num = 0;
					if(script->interpolateHealth)
						interpolationSpeed = script->interpolationSpeed;
					break;
				case ARMOR:
					num = statusBar->armor != NULL ? statusBar->armor->Amount : 0;
					if(script->interpolateArmor)
						interpolationSpeed = script->armorInterpolationSpeed;
					break;
				case AMMO1:
					if(statusBar->ammo1 == NULL) //no ammo, do not draw
					{
						str = "";
						return;
					}
					num = statusBar->ammocount1;
					break;
				case AMMO2:
					if(statusBar->ammo2 == NULL) //no ammo, do not draw
					{
						str = "";
						return;
					}
					num = statusBar->ammocount2;
					break;
				case AMMO:
				{
					AInventory* item = statusBar->CPlayer->mo->FindInventory(inventoryItem);
					if(item != NULL)
						num = item->Amount;
					else
						num = 0;
					break;
				}
				case AMMO1CAPACITY:
					if(statusBar->ammo1 == NULL) //no ammo, do not draw
					{
						str = "";
						return;
					}
					else
						num = statusBar->ammo1->MaxAmount;
					break;
				case AMMO2CAPACITY:
					if(statusBar->ammo2 == NULL) //no ammo, do not draw
					{
						str = "";
						return;
					}
					else
						num = statusBar->ammo2->MaxAmount;
					break;
				case AMMOCAPACITY:
				{
					AInventory* item = statusBar->CPlayer->mo->FindInventory(inventoryItem);
					if(item != NULL)
						num = item->MaxAmount;
					else
						num = ((AInventory *)GetDefaultByType(inventoryItem))->MaxAmount;
					break;
				}
				case FRAGS:
					num = statusBar->CPlayer->fragcount;
					break;
				case KILLS:
					num = level.killed_monsters;
					break;
				case MONSTERS:
					num = level.total_monsters;
					break;
				case ITEMS:
					num = level.found_items;
					break;
				case TOTALITEMS:
					num = level.total_items;
					break;
				case SECRETS:
					num = level.found_secrets;
					break;
				case SCORE:
					num = statusBar->CPlayer->mo->Score;
					break;
				case TOTALSECRETS:
					num = level.total_secrets;
					break;
				case ARMORCLASS:
				case SAVEPERCENT:
				{
					double add = 0;
					AHexenArmor *harmor = statusBar->CPlayer->mo->FindInventory<AHexenArmor>();
					if(harmor != NULL)
					{
						add = harmor->Slots[0] + harmor->Slots[1] +
							harmor->Slots[2] + harmor->Slots[3] + harmor->Slots[4];
					}
					//Hexen counts basic armor also so we should too.
					if(statusBar->armor != NULL)
					{
						add += statusBar->armor->SavePercent * 100;
					}
					if(value == ARMORCLASS)
						add /= 5;
					num = int(add);
					break;
				}
				case GLOBALVAR:
					num = ACS_GlobalVars[valueArgument];
					break;
				case GLOBALARRAY:
					num = ACS_GlobalArrays[valueArgument][consoleplayer];
					break;
				case POWERUPTIME:
				{
					//Get the PowerupType and check to see if the player has any in inventory.
					PClassActor* powerupType = ((APowerupGiver*) GetDefaultByType(inventoryItem))->PowerupType;
					APowerup* powerup = (APowerup*) statusBar->CPlayer->mo->FindInventory(powerupType);
					if(powerup != NULL)
						num = powerup->EffectTics / TICRATE + 1;
					break;
				}
				case INVENTORY:
				{
					AInventory* item = statusBar->CPlayer->mo->FindInventory(inventoryItem);
					if(item != NULL)
						num = item->Amount;
					else
						num = 0;
					break;
				}
				case AIRTIME:
				{
					if(statusBar->CPlayer->mo->waterlevel < 3)
						num = level.airsupply/TICRATE;
					else
						num = clamp<int>((statusBar->CPlayer->air_finished - level.time + (TICRATE-1))/TICRATE, 0, INT_MAX);
					break;
				}
				case SELECTEDINVENTORY:
					if(statusBar->CPlayer->mo->InvSel != NULL)
						num = statusBar->CPlayer->mo->InvSel->Amount;
					break;
				case ACCURACY:
					num = statusBar->CPlayer->mo->accuracy;
					break;
				case STAMINA:
					num = statusBar->CPlayer->mo->stamina;
					break;
				case KEYS:
					num = 0;
					for(AInventory *item = statusBar->CPlayer->mo->Inventory;item != NULL;item = item->Inventory)
					{
						if(item->IsKindOf(RUNTIME_CLASS(AKey)))
							num++;
					}
					break;
				case INTCVAR:
				{
					FBaseCVar *CVar = GetCVar(statusBar->CPlayer->mo, cvarName);
					if (CVar != nullptr)
					{
						ECVarType cvartype = CVar->GetRealType();

						if (cvartype == CVAR_Bool || cvartype == CVAR_Int)
						{
							num = CVar->GetGenericRep(CVAR_Int).Int;
							break;
						}
					}

					// Fallback in case of bad cvar/type. Unset can remove a cvar at will.
					num = 0;
					break;
				}
				default: break;
			}
			if(interpolationSpeed != 0 && (!hudChanged || level.time == 1))
			{
				if(num < drawValue)
					drawValue -= clamp<int>((drawValue - num) >> 2, 1, interpolationSpeed);
				else if(drawValue < num)
					drawValue += clamp<int>((num - drawValue) >> 2, 1, interpolationSpeed);
			}
			else
				drawValue = num;
			if(whenNotZero && drawValue == 0)
			{
				str = "";
				return;
			}
		
			translation = normalTranslation;
			if(lowValue != -1 && drawValue <= lowValue) //low
				translation = lowTranslation;
			else if(highValue != -1 && drawValue >= highValue) //high
				translation = highTranslation;

			bool useFillZeros = fillZeros;
			if(!dontCap)
			{
				// 10^9 is a largest we can hold in a 32-bit int.  So if we go any larger we have to toss out the positions limit.
				int maxval = length <= 9 ? (int) ceil(pow(10., length))-1 : INT_MAX;
				if(!fillZeros || length == 1)
					drawValue = clamp(drawValue, -maxval, maxval);
				else //The community wanted negatives to take the last digit, but we can only do this if there is room
					drawValue = clamp(drawValue, length <= 9 ? (int) -(ceil(pow(10., length-1))-1) : INT_MIN, maxval);
			}
			else if(length <= 9)
			{
				int limit = (int) ceil(pow(10., length > 1 && drawValue < 0 ? length - 1 : length));
				if(drawValue >= limit)
					useFillZeros = true;
				drawValue = drawValue%limit;
			}

			if(useFillZeros)
				str.Format("%s%s%0*d", usePrefix ? str.GetChars() : "", prefixPadding.GetChars(), drawValue < 0 ? length - 1 : length, drawValue);
			else
				str.Format("%s%s%d", usePrefix ? str.GetChars() : "", prefixPadding.GetChars(), drawValue);

			RealignString();
		}